

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdAddTxPegoutOutput
              (void *handle,void *create_handle,char *asset,int64_t amount,
              int mainchain_network_type,int elements_network_type,
              char *mainchain_genesis_block_hash,char *online_pubkey,char *master_online_key,
              char *mainchain_output_descriptor,uint32_t bip32_counter,char *whitelist,
              char **mainchain_address)

{
  string *psVar1;
  pointer pcVar2;
  ConfidentialTransactionContext *this;
  pointer puVar3;
  undefined8 uVar4;
  size_type sVar5;
  bool bVar6;
  NetType NVar7;
  NetType NVar8;
  size_t sVar9;
  char *pcVar10;
  CfdException *pCVar11;
  bool is_bitcoin;
  void *local_488;
  NetType local_47c;
  Privkey local_478;
  ulong local_458;
  int64_t local_450;
  Address btc_derive_address;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  BlockHash local_250;
  string local_230;
  ConfidentialAssetId local_210;
  ByteData local_1e8;
  Pubkey local_1d0;
  Amount local_1b8;
  undefined1 local_1a8 [32];
  undefined1 local_188 [16];
  pointer local_178;
  pointer local_160;
  pointer local_148;
  TapBranch local_130;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_b8;
  Script local_a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  
  local_488 = handle;
  cfd::Initialize();
  psVar1 = &btc_derive_address.address_;
  btc_derive_address._0_8_ = psVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&btc_derive_address,"TransactionData","");
  cfd::capi::CheckBuffer(create_handle,(string *)&btc_derive_address);
  if ((string *)btc_derive_address._0_8_ != psVar1) {
    operator_delete((void *)btc_derive_address._0_8_);
  }
  local_450 = amount;
  if (asset == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbc2;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&btc_derive_address,kCfdLogLevelWarning,"asset is null.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,"Failed to parameter. asset is null.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_genesis_block_hash == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbc8;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&btc_derive_address,kCfdLogLevelWarning,
               "mainchain_genesis_block_hash is null.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = psVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,
               "Failed to parameter. mainchain_genesis_block_hash is null.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (online_pubkey == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbce;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&btc_derive_address,kCfdLogLevelWarning,"online_pubkey is null."
              );
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = &btc_derive_address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,"Failed to parameter. online_pubkey is null.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (master_online_key == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbd4;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&btc_derive_address,kCfdLogLevelWarning,
               "master_online_key is null.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = &btc_derive_address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,"Failed to parameter. master_online_key is null.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_output_descriptor == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbda;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&btc_derive_address,kCfdLogLevelWarning,
               "mainchain_output_descriptor is null.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = &btc_derive_address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,
               "Failed to parameter. mainchain_output_descriptor is null.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (whitelist == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbe0;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&btc_derive_address,kCfdLogLevelWarning,"whitelist is null.");
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = &btc_derive_address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,"Failed to parameter. whitelist is null.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  if (*(long *)((long)create_handle + 0x18) != 0) {
    if (is_bitcoin == true) {
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      btc_derive_address._0_8_ = &btc_derive_address.address_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&btc_derive_address,"Invalid handle state. tx is bitcoin.","");
      cfd::core::CfdException::CfdException
                (pCVar11,kCfdIllegalStateError,(string *)&btc_derive_address);
      __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
      ;
    }
    NVar7 = cfd::capi::ConvertNetType(mainchain_network_type,&is_bitcoin);
    if (is_bitcoin != false) {
      NVar8 = cfd::capi::ConvertNetType(elements_network_type,&is_bitcoin);
      if (is_bitcoin != true) {
        local_47c = NVar7;
        cfd::core::Privkey::Privkey(&local_478);
        btc_derive_address._0_8_ = &btc_derive_address.address_;
        sVar9 = strlen(master_online_key);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&btc_derive_address,master_online_key,master_online_key + sVar9);
        bVar6 = cfd::core::Privkey::HasWif((string *)&btc_derive_address,(NetType *)0x0,(bool *)0x0)
        ;
        local_458 = (ulong)NVar8;
        if ((string *)btc_derive_address._0_8_ != &btc_derive_address.address_) {
          operator_delete((void *)btc_derive_address._0_8_);
        }
        pcVar2 = local_1a8 + 0x10;
        local_1a8._0_8_ = pcVar2;
        if (bVar6) {
          sVar9 = strlen(master_online_key);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,master_online_key,master_online_key + sVar9);
          cfd::core::Privkey::FromWif
                    ((Privkey *)&btc_derive_address,(string *)local_1a8,kCustomChain,true);
          local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)btc_derive_address.address_._M_dataplus;
          local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)btc_derive_address._8_8_;
          uVar4 = btc_derive_address._0_8_;
          puVar3 = local_478.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)btc_derive_address._0_8_;
          btc_derive_address.type_ = kCfdSuccess;
          btc_derive_address.addr_type_ = 0;
          btc_derive_address.witness_ver_ = kVersion0;
          btc_derive_address._12_4_ = 0;
          btc_derive_address.address_._M_dataplus._M_p = (pointer)0x0;
          sVar5 = btc_derive_address.address_._M_string_length;
          if (puVar3 != (pointer)0x0) {
            operator_delete(puVar3);
            local_478.is_compressed_ =
                 (bool)(undefined1)btc_derive_address.address_._M_string_length;
            local_478._25_3_ = btc_derive_address.address_._M_string_length._1_3_;
            local_478.net_type_ = btc_derive_address.address_._M_string_length._4_4_;
            sVar5 = btc_derive_address.address_._M_string_length;
            if (btc_derive_address._0_8_ != 0) {
              operator_delete((void *)btc_derive_address._0_8_);
              sVar5 = local_478._24_8_;
            }
          }
        }
        else {
          sVar9 = strlen(master_online_key);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1a8,master_online_key,master_online_key + sVar9);
          cfd::core::Privkey::Privkey
                    ((Privkey *)&btc_derive_address,(string *)local_1a8,kMainnet,true);
          local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)btc_derive_address.address_._M_dataplus;
          local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)btc_derive_address._8_8_;
          uVar4 = btc_derive_address._0_8_;
          puVar3 = local_478.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)btc_derive_address._0_8_;
          btc_derive_address.type_ = kCfdSuccess;
          btc_derive_address.addr_type_ = 0;
          btc_derive_address.witness_ver_ = kVersion0;
          btc_derive_address._12_4_ = 0;
          btc_derive_address.address_._M_dataplus._M_p = (pointer)0x0;
          sVar5 = btc_derive_address.address_._M_string_length;
          if (puVar3 != (pointer)0x0) {
            operator_delete(puVar3);
            local_478.is_compressed_ =
                 (bool)(undefined1)btc_derive_address.address_._M_string_length;
            local_478._25_3_ = btc_derive_address.address_._M_string_length._1_3_;
            local_478.net_type_ = btc_derive_address.address_._M_string_length._4_4_;
            sVar5 = btc_derive_address.address_._M_string_length;
            if (btc_derive_address._0_8_ != 0) {
              operator_delete((void *)btc_derive_address._0_8_);
              sVar5 = local_478._24_8_;
            }
          }
        }
        local_478._24_8_ = sVar5;
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_);
        }
        this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
        cfd::core::Address::Address(&btc_derive_address);
        cfd::core::Amount::Amount(&local_1b8,local_450);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        sVar9 = strlen(asset);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,asset,asset + sVar9);
        cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_210,&local_290);
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        sVar9 = strlen(mainchain_genesis_block_hash);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2b0,mainchain_genesis_block_hash,
                   mainchain_genesis_block_hash + sVar9);
        cfd::core::BlockHash::BlockHash(&local_250,&local_2b0);
        cfd::core::Address::Address((Address *)local_1a8);
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        sVar9 = strlen(online_pubkey);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2d0,online_pubkey,online_pubkey + sVar9);
        cfd::core::Pubkey::Pubkey(&local_1d0,&local_2d0);
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        sVar9 = strlen(mainchain_output_descriptor);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_270,mainchain_output_descriptor,
                   mainchain_output_descriptor + sVar9);
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        sVar9 = strlen(whitelist);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_230,whitelist,whitelist + sVar9);
        cfd::core::ByteData::ByteData(&local_1e8,&local_230);
        cfd::ConfidentialTransactionContext::AddPegoutTxOut
                  (this,&local_1b8,&local_210,&local_250,(Address *)local_1a8,local_47c,&local_1d0,
                   &local_478,&local_270,bip32_counter,&local_1e8,(NetType)local_458,
                   &btc_derive_address);
        if (local_1e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1e8.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p);
        }
        if (local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1d0.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
          operator_delete(local_2d0._M_dataplus._M_p);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree(&local_60);
        cfd::core::Script::~Script(&local_a0);
        local_130._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&local_b8);
        cfd::core::TapBranch::~TapBranch(&local_130);
        if (local_148 != (pointer)0x0) {
          operator_delete(local_148);
        }
        if (local_160 != (pointer)0x0) {
          operator_delete(local_160);
        }
        if (local_178 != (pointer)0x0) {
          operator_delete(local_178);
        }
        if ((undefined1 *)local_1a8._16_8_ != local_188) {
          operator_delete((void *)local_1a8._16_8_);
        }
        local_250._vptr_BlockHash = (_func_int **)&PTR__BlockHash_00723790;
        if (local_250.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_250.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
          operator_delete(local_2b0._M_dataplus._M_p);
        }
        local_210._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
        if (local_210.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p);
        }
        if (mainchain_address != (char **)0x0) {
          cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1a8,&btc_derive_address);
          pcVar10 = cfd::capi::CreateString((string *)local_1a8);
          *mainchain_address = pcVar10;
          if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
            operator_delete((void *)local_1a8._0_8_);
          }
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&btc_derive_address.format_data_);
        cfd::core::Script::~Script(&btc_derive_address.redeem_script_);
        btc_derive_address.script_tree_.super_TapBranch._vptr_TapBranch =
             (_func_int **)&PTR__TaprootScriptTree_0072eb30;
        std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                  (&btc_derive_address.script_tree_.nodes_);
        cfd::core::TapBranch::~TapBranch(&btc_derive_address.script_tree_.super_TapBranch);
        if (btc_derive_address.schnorr_pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(btc_derive_address.schnorr_pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (btc_derive_address.pubkey_.data_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(btc_derive_address.pubkey_.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (btc_derive_address.hash_.data_.
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(btc_derive_address.hash_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)btc_derive_address.address_._M_dataplus._M_p != &btc_derive_address.address_.field_2)
        {
          operator_delete(btc_derive_address.address_._M_dataplus._M_p);
        }
        if (local_478.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_478.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        return 0;
      }
      pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
      btc_derive_address._0_8_ = &btc_derive_address.address_;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&btc_derive_address,"Invalid network type.","");
      cfd::core::CfdException::CfdException
                (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
      __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
      ;
    }
    pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
    btc_derive_address._0_8_ = &btc_derive_address.address_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&btc_derive_address,"Invalid mainchain network type.","");
    cfd::core::CfdException::CfdException
              (pCVar11,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar11 = (CfdException *)__cxa_allocate_exception(0x30);
  btc_derive_address._0_8_ = &btc_derive_address.address_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&btc_derive_address,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar11,kCfdIllegalStateError,(string *)&btc_derive_address)
  ;
  __cxa_throw(pCVar11,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxPegoutOutput(
    void* handle, void* create_handle, const char* asset, int64_t amount,
    int mainchain_network_type, int elements_network_type,
    const char* mainchain_genesis_block_hash, const char* online_pubkey,
    const char* master_online_key, const char* mainchain_output_descriptor,
    uint32_t bip32_counter, const char* whitelist, char** mainchain_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (asset == nullptr) {
      warn(CFD_LOG_SOURCE, "asset is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null.");
    }
    if (mainchain_genesis_block_hash == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_genesis_block_hash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_genesis_block_hash is null.");
    }
    if (online_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "online_pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. online_pubkey is null.");
    }
    if (master_online_key == nullptr) {
      warn(CFD_LOG_SOURCE, "master_online_key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master_online_key is null.");
    }
    if (mainchain_output_descriptor == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_output_descriptor is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_output_descriptor is null.");
    }
    if (whitelist == nullptr) {
      warn(CFD_LOG_SOURCE, "whitelist is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. whitelist is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    auto mainchain_net_type =
        ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid mainchain network type.");
    }
    auto elements_net_type =
        ConvertNetType(elements_network_type, &is_bitcoin);
    if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid network type.");
    }
    Privkey master_online_privkey;
    if (Privkey::HasWif(master_online_key)) {
      master_online_privkey = Privkey::FromWif(master_online_key);
    } else {
      master_online_privkey = Privkey(master_online_key);
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    Address btc_derive_address;
    tx->AddPegoutTxOut(
        Amount(amount), ConfidentialAssetId(asset),
        BlockHash(mainchain_genesis_block_hash), Address(), mainchain_net_type,
        Pubkey(online_pubkey), master_online_privkey,
        mainchain_output_descriptor, bip32_counter, ByteData(whitelist),
        elements_net_type, &btc_derive_address);

    if (mainchain_address != nullptr) {
      *mainchain_address = CreateString(btc_derive_address.GetAddress());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}